

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall
mario::TimerQueue::reset
          (TimerQueue *this,
          vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
          *expired,Timestamp now)

{
  _Any_data *p_Var1;
  iterator iVar2;
  pointer ppVar3;
  Timestamp nextExpire;
  ActiveTimer timer;
  Timestamp local_50;
  Timestamp local_48;
  key_type local_40;
  
  local_48._microSecondsSinceEpoch = now._microSecondsSinceEpoch;
  Timestamp::Timestamp(&local_50);
  ppVar3 = (expired->
           super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar3 != (expired->
                super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_40.first = ppVar3->second;
      local_40.second = (local_40.first)->_sequence;
      if ((local_40.first)->_repeat == true) {
        iVar2 = std::
                _Rb_tree<std::pair<mario::Timer_*,_long>,_std::pair<mario::Timer_*,_long>,_std::_Identity<std::pair<mario::Timer_*,_long>_>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
                ::find(&(this->_cancelingTimers)._M_t,&local_40);
        if ((_Rb_tree_header *)iVar2._M_node !=
            &(this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header) goto LAB_0010ad6a;
        Timer::restart(ppVar3->second,local_48);
        insert(this,ppVar3->second);
      }
      else {
LAB_0010ad6a:
        p_Var1 = (_Any_data *)ppVar3->second;
        if (p_Var1 != (_Any_data *)0x0) {
          if (*(code **)(p_Var1 + 1) != (code *)0x0) {
            (**(code **)(p_Var1 + 1))(p_Var1,p_Var1,__destroy_functor);
          }
          operator_delete(p_Var1);
        }
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != (expired->
                       super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((this->_timers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_50._microSecondsSinceEpoch =
         *(int64_t *)
          ((this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent + 1);
  }
  if (0 < local_50._microSecondsSinceEpoch) {
    detail::resetTimerfd(this->_timerfd,local_50);
  }
  return;
}

Assistant:

void TimerQueue::reset(const std::vector<Entry>& expired, Timestamp now) {
    Timestamp nextExpire;

    for (auto it = expired.cbegin(); it != expired.cend(); ++it) {
        ActiveTimer timer(it->second, it->second->sequence());
        if (it->second->repeat() && _cancelingTimers.find(timer) == _cancelingTimers.end()) {
            it->second->restart(now);
            insert(it->second);
        } else {
            delete it->second;
        }
    }

    if (!_timers.empty()) {
        nextExpire = _timers.begin()->second->expiration();
    }
    if (nextExpire.valid()) {
        resetTimerfd(_timerfd, nextExpire);
    }
}